

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O1

double Gudhi::Persistence_representations::compute_inner_product
                 (Persistence_landscape *l1,Persistence_landscape *l2)

{
  ulong uVar1;
  long lVar2;
  pointer pvVar3;
  pointer pvVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  
  pvVar3 = (l1->land).
           super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(l1->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
          -0x5555555555555555;
  pvVar4 = (l2->land).
           super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar12 = ((long)(l2->land).
                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
           -0x5555555555555555;
  if (uVar8 <= uVar12) {
    uVar12 = uVar8;
  }
  dVar17 = 0.0;
  if (uVar12 != 0) {
    uVar8 = 0;
    do {
      lVar5 = *(long *)&pvVar3[uVar8].
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl;
      uVar13 = (long)*(pointer *)
                      ((long)&pvVar3[uVar8].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl + 8) - lVar5 >> 4;
      lVar6 = *(long *)&pvVar4[uVar8].
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl;
      uVar14 = (long)*(pointer *)
                      ((long)&pvVar4[uVar8].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl + 8) - lVar6 >> 4;
      if (uVar14 * uVar13 != 0) {
        dVar18 = *(double *)(lVar5 + 0x10);
        if (*(double *)(lVar6 + 0x10) <= *(double *)(lVar5 + 0x10)) {
          dVar18 = *(double *)(lVar6 + 0x10);
        }
        uVar9 = 0;
        uVar15 = 0;
        dVar19 = -2147483647.0;
        do {
          if ((uVar13 - 1 <= uVar15) || (uVar14 - 1 <= uVar9)) break;
          lVar10 = (uVar15 + 1) * 0x10;
          dVar24 = *(double *)(lVar5 + lVar10);
          lVar2 = lVar5 + uVar15 * 0x10;
          dVar21 = *(double *)(lVar5 + uVar15 * 0x10);
          dVar22 = 0.0;
          dVar20 = 0.0;
          if ((dVar24 != dVar21) || (NAN(dVar24) || NAN(dVar21))) {
            dVar20 = (*(double *)(lVar10 + lVar5 + 8) - *(double *)(lVar2 + 8)) / (dVar24 - dVar21);
          }
          uVar1 = uVar9 + 1;
          dVar25 = *(double *)(lVar6 + uVar1 * 0x10);
          lVar10 = lVar6 + uVar9 * 0x10;
          dVar23 = *(double *)(lVar6 + uVar9 * 0x10);
          if ((dVar25 != dVar23) || (NAN(dVar25) || NAN(dVar23))) {
            dVar22 = (*(double *)(uVar1 * 0x10 + lVar6 + 8) - *(double *)(lVar10 + 8)) /
                     (dVar25 - dVar23);
          }
          uVar11 = uVar1;
          if (dVar18 != dVar25) {
            uVar11 = uVar9;
          }
          if (NAN(dVar18) || NAN(dVar25)) {
            uVar11 = uVar9;
          }
          uVar16 = uVar15 + 1;
          if (dVar18 != dVar24) {
            uVar16 = uVar15;
          }
          if (NAN(dVar18) || NAN(dVar24)) {
            uVar16 = uVar15;
          }
          if (dVar18 != dVar24) {
            uVar11 = uVar1;
          }
          uVar9 = uVar11;
          if (NAN(dVar18) || NAN(dVar24)) {
            uVar9 = uVar1;
          }
          if ((uVar16 + 1 < uVar13) && (uVar9 + 1 < uVar14)) {
            dVar24 = *(double *)(lVar5 + (uVar16 + 1) * 0x10);
            dVar25 = *(double *)(lVar6 + (uVar9 + 1) * 0x10);
            if (dVar25 <= dVar24) {
              dVar24 = dVar25;
            }
            bVar7 = true;
            dVar25 = dVar18;
          }
          else {
            bVar7 = false;
            dVar24 = dVar18;
            dVar25 = dVar19;
          }
          dVar26 = *(double *)(lVar2 + 8) - dVar21 * dVar20;
          dVar23 = *(double *)(lVar10 + 8) - dVar23 * dVar22;
          dVar21 = dVar20 * dVar23 + dVar22 * dVar26;
          dVar23 = dVar23 * dVar26;
          dVar17 = dVar17 + ((dVar18 * dVar23 +
                             dVar18 * dVar21 * dVar18 * 0.5 +
                             (dVar18 * dVar20 * dVar22 * dVar18 * dVar18) / 3.0) -
                            (dVar23 * dVar19 +
                            dVar21 * dVar19 * dVar19 * 0.5 +
                            (dVar20 * dVar22 * dVar19 * dVar19 * dVar19) / 3.0));
          uVar15 = uVar16;
          dVar18 = dVar24;
          dVar19 = dVar25;
        } while (bVar7);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar12);
  }
  return dVar17;
}

Assistant:

double compute_inner_product(const Persistence_landscape& l1, const Persistence_landscape& l2) {
  bool dbg = false;
  double result = 0;

  for (size_t level = 0; level != std::min(l1.size(), l2.size()); ++level) {
    if (dbg) {
      std::clog << "Computing inner product for a level : " << level << std::endl;
      getchar();
    }
    auto&& l1_land_level = l1.land[level];
    auto&& l2_land_level = l2.land[level];

    if (l1_land_level.size() * l2_land_level.size() == 0) continue;

    // endpoints of the interval on which we will compute the inner product of two locally linear functions:
    double x1 = -std::numeric_limits<int>::max();
    double x2;
    if (l1_land_level[1].first < l2_land_level[1].first) {
      x2 = l1_land_level[1].first;
    } else {
      x2 = l2_land_level[1].first;
    }

    // iterators for the landscapes l1 and l2
    size_t l1It = 0;
    size_t l2It = 0;

    while ((l1It < l1_land_level.size() - 1) && (l2It < l2_land_level.size() - 1)) {
      // compute the value of a inner product on a interval [x1,x2]

      double a, b, c, d;

      if (l1_land_level[l1It + 1].first != l1_land_level[l1It].first) {
        a = (l1_land_level[l1It + 1].second - l1_land_level[l1It].second) /
            (l1_land_level[l1It + 1].first - l1_land_level[l1It].first);
      } else {
        a = 0;
      }
      b = l1_land_level[l1It].second - a * l1_land_level[l1It].first;
      if (l2_land_level[l2It + 1].first != l2_land_level[l2It].first) {
        c = (l2_land_level[l2It + 1].second - l2_land_level[l2It].second) /
            (l2_land_level[l2It + 1].first - l2_land_level[l2It].first);
      } else {
        c = 0;
      }
      d = l2_land_level[l2It].second - c * l2_land_level[l2It].first;

      double contributionFromThisPart = (a * c * x2 * x2 * x2 / 3 + (a * d + b * c) * x2 * x2 / 2 + b * d * x2) -
                                        (a * c * x1 * x1 * x1 / 3 + (a * d + b * c) * x1 * x1 / 2 + b * d * x1);

      result += contributionFromThisPart;

      if (dbg) {
        std::clog << "[l1_land_level[l1It].first,l1_land_level[l1It+1].first] : " << l1_land_level[l1It].first
                  << " , " << l1_land_level[l1It + 1].first << std::endl;
        std::clog << "[l2_land_level[l2It].first,l2_land_level[l2It+1].first] : " << l2_land_level[l2It].first
                  << " , " << l2_land_level[l2It + 1].first << std::endl;
        std::clog << "a : " << a << ", b : " << b << " , c: " << c << ", d : " << d << std::endl;
        std::clog << "x1 : " << x1 << " , x2 : " << x2 << std::endl;
        std::clog << "contributionFromThisPart : " << contributionFromThisPart << std::endl;
        std::clog << "result : " << result << std::endl;
        getchar();
      }

      // we have two intervals in which functions are constant:
      // [l1_land_level[l1It].first , l1_land_level[l1It+1].first]
      // and
      // [l2_land_level[l2It].first , l2_land_level[l2It+1].first]
      // We also have an interval [x1,x2]. Since the intervals in the landscapes cover the whole R, then it is clear
      // that x2
      // is either l1_land_level[l1It+1].first of l2_land_level[l2It+1].first or both. Lets test it.
      if (x2 == l1_land_level[l1It + 1].first) {
        if (x2 == l2_land_level[l2It + 1].first) {
          // in this case, we increment both:
          ++l2It;
          if (dbg) {
            std::clog << "Incrementing both \n";
          }
        } else {
          if (dbg) {
            std::clog << "Incrementing first \n";
          }
        }
        ++l1It;
      } else {
        // in this case we increment l2It
        ++l2It;
        if (dbg) {
          std::clog << "Incrementing second \n";
        }
      }

      if ( l1It + 1 >= l1_land_level.size()  )break;
      if ( l2It + 1 >= l2_land_level.size()  )break;

      // Now, we shift x1 and x2:
      x1 = x2;
      if (l1_land_level[l1It + 1].first < l2_land_level[l2It + 1].first) {
        x2 = l1_land_level[l1It + 1].first;
      } else {
        x2 = l2_land_level[l2It + 1].first;
      }
    }
  }
  return result;
}